

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::torrent::on_file_renamed
          (torrent *this,string *filename,file_index_t file_idx,storage_error *error)

{
  _Atomic_word *p_Var1;
  byte bVar2;
  _func_int *p_Var3;
  element_type *this_00;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> index;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> local_84;
  undefined1 local_80 [32];
  undefined1 local_60 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  
  p_Var3 = (((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[5]
  ;
  local_84.m_val = file_idx.m_val;
  if ((error->ec).val_ == 0) {
    iVar4 = (*p_Var3)();
    if ((*(uint *)(CONCAT44(extraout_var_01,iVar4) + 0x68) & 8) != 0) {
      iVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      get_handle((torrent *)local_60);
      index.m_val = local_84.m_val;
      this_00 = (this->super_torrent_hot_members).m_torrent_file.
                super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_80._0_8_ = local_80 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"");
      file_storage::file_path
                ((string *)(local_60 + 0x10),&this_00->m_files,(file_index_t)index.m_val,
                 (string *)local_80);
      alert_manager::
      emplace_alert<libtorrent::file_renamed_alert,libtorrent::torrent_handle,std::__cxx11::string_const&,std::__cxx11::string,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>const&>
                ((alert_manager *)CONCAT44(extraout_var_02,iVar4),(torrent_handle *)local_60,
                 filename,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_60 + 0x10),&local_84);
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_60._16_8_ != &local_40) {
        operator_delete((void *)local_60._16_8_,
                        (ulong)((long)&(local_40._M_pi)->_vptr__Sp_counted_base + 1));
      }
      if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
        operator_delete((void *)local_80._0_8_,(ulong)(local_80._16_8_ + 1));
      }
      if ((_Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
           )local_60._8_8_ != (piece_picker *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = (_Atomic_word *)(local_60._8_8_ + 0xc);
          iVar4 = *p_Var1;
          *p_Var1 = *p_Var1 + -1;
          UNLOCK();
        }
        else {
          iVar4 = *(_Atomic_word *)(local_60._8_8_ + 0xc);
          *(int *)(local_60._8_8_ + 0xc) = iVar4 + -1;
        }
        if (iVar4 == 1) {
          (*(code *)(((vector<piece_pos,_piece_index_t> *)local_60._8_8_)->
                    super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                    ).
                    super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                    ._M_impl.super__Vector_impl_data._M_start[3])();
        }
      }
    }
    torrent_info::rename_file
              ((this->super_torrent_hot_members).m_torrent_file.
               super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (file_index_t)local_84.m_val,filename);
    bVar2 = (this->m_need_save_resume_data).m_val;
    if ((bVar2 & 0x40) == 0) {
      (this->m_need_save_resume_data).m_val = bVar2 | 0x40;
      state_updated(this);
    }
  }
  else {
    iVar4 = (*p_Var3)();
    if ((*(uint *)(CONCAT44(extraout_var,iVar4) + 0x68) & 8) != 0) {
      iVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      get_handle((torrent *)local_80);
      alert_manager::
      emplace_alert<libtorrent::file_rename_failed_alert,libtorrent::torrent_handle,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>const&,boost::system::error_code_const&>
                ((alert_manager *)CONCAT44(extraout_var_00,iVar4),(torrent_handle *)local_80,
                 &local_84,&error->ec);
      if ((piece_picker *)local_80._8_8_ != (piece_picker *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = (_Atomic_word *)(local_80._8_8_ + 0xc);
          iVar4 = *p_Var1;
          *p_Var1 = *p_Var1 + -1;
          UNLOCK();
        }
        else {
          iVar4 = *(_Atomic_word *)(local_80._8_8_ + 0xc);
          *(int *)(local_80._8_8_ + 0xc) = iVar4 + -1;
        }
        if (iVar4 == 1) {
          (*(*(_func_int ***)local_80._8_8_)[3])();
        }
      }
    }
  }
  return;
}

Assistant:

void torrent::on_file_renamed(std::string const& filename
		, file_index_t const file_idx
		, storage_error const& error) try
	{
		TORRENT_ASSERT(is_single_thread());

		if (error)
		{
			if (alerts().should_post<file_rename_failed_alert>())
				alerts().emplace_alert<file_rename_failed_alert>(get_handle()
					, file_idx, error.ec);
		}
		else
		{
			if (alerts().should_post<file_renamed_alert>())
				alerts().emplace_alert<file_renamed_alert>(get_handle()
					, filename, m_torrent_file->files().file_path(file_idx), file_idx);
			m_torrent_file->rename_file(file_idx, filename);

			set_need_save_resume(torrent_handle::if_state_changed);
		}
	}
	catch (...) { handle_exception(); }